

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx_main.cpp
# Opt level: O0

void __thiscall ktx::Tools::printUsage(Tools *this,ostream *os,Options *options)

{
  format_string<std::__cxx11::basic_string<char>_> fmt;
  format_string<> fmt_00;
  format_string<> fmt_01;
  format_string<> fmt_02;
  format_string<> fmt_03;
  format_string<> fmt_04;
  format_string<> fmt_05;
  format_string<> fmt_06;
  format_string<> fmt_07;
  format_string<> fmt_08;
  format_string<> fmt_09;
  format_string<> fmt_10;
  format_string<> fmt_11;
  format_string<> fmt_12;
  char *pcVar1;
  Options *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbb0;
  char **ppcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  ostream *in_stack_fffffffffffffbd0;
  ostream *os_00;
  char *in_stack_fffffffffffffbd8;
  Options *pOVar3;
  size_t in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffc58;
  undefined1 print_usage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffc60;
  char **ppcVar4;
  char *local_378 [2];
  char *local_368;
  size_t local_360;
  char *local_358;
  size_t local_350;
  char *local_348;
  size_t local_340;
  char *local_338;
  size_t local_330;
  char *local_328;
  size_t local_320;
  char *local_318;
  size_t local_310;
  char *local_308;
  size_t local_300;
  char *local_2f8 [2];
  char *local_2e8 [2];
  char *local_2d8;
  size_t local_2d0;
  char *local_2c8 [2];
  char *local_2b8;
  size_t local_2b0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  string local_278 [32];
  char *local_258;
  size_t local_250;
  Options *local_240;
  char *local_230;
  char **local_228;
  char *local_220;
  char **local_218;
  char *local_210;
  char **local_208;
  char *local_200;
  char **local_1f8;
  char *local_1f0;
  char **local_1e8;
  char *local_1e0;
  char **local_1d8;
  char *local_1d0;
  ostream *local_1c8;
  char *local_1c0;
  char **local_1b8;
  char *local_1b0;
  char **local_1a8;
  char *local_1a0;
  char **local_198;
  char *local_190;
  char **local_188;
  char *local_180;
  char **local_178;
  char *local_170;
  char **local_168;
  char *local_160;
  char **local_158;
  char *local_150;
  char **local_148;
  char *local_140;
  char **local_138;
  char *local_130;
  char **local_128;
  char *local_120;
  char **local_118;
  char *local_110;
  char **local_108;
  char *local_100;
  char **local_f8;
  char *local_f0;
  char **local_e8;
  char *local_e0;
  ostream *local_d8;
  char *local_d0;
  char **local_c8;
  char *local_c0;
  char **local_b8;
  char *local_b0;
  char **local_a8;
  char *local_a0;
  char **local_98;
  char *local_90;
  char **local_88;
  char *local_80;
  char **local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  print_usage = (undefined1)((ulong)in_stack_fffffffffffffc58 >> 0x38);
  local_228 = &local_258;
  local_230 = "{}";
  local_80 = "{}";
  local_258 = "{}";
  local_240 = in_RSI;
  local_78 = local_228;
  local_250 = std::char_traits<char>::length((char_type *)0x2ab2f6);
  local_70 = local_230;
  local_298 = 0;
  uStack_290 = 0;
  local_288 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2ab351);
  cxxopts::Options::help(in_RSI,in_stack_fffffffffffffc60,(bool)print_usage);
  fmt.str_.size_ = in_stack_fffffffffffffbe0;
  fmt.str_.data_ = in_stack_fffffffffffffbd8;
  ::fmt::v10::print<std::__cxx11::string>(in_stack_fffffffffffffbd0,fmt,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_278);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffbb0);
  local_218 = &local_2b8;
  local_220 = "\n";
  local_90 = "\n";
  local_2b8 = "\n";
  local_88 = local_218;
  local_2b0 = std::char_traits<char>::length((char_type *)0x2ab426);
  local_60 = local_220;
  fmt_00.str_.size_ = in_stack_fffffffffffffbe0;
  fmt_00.str_.data_ = in_stack_fffffffffffffbd8;
  ::fmt::v10::print<>(in_stack_fffffffffffffbd0,fmt_00);
  ppcVar2 = local_2c8;
  local_200 = "Available commands:\n";
  local_b0 = "Available commands:\n";
  local_2c8[0] = "Available commands:\n";
  local_1f8 = ppcVar2;
  local_a8 = ppcVar2;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2ab4cc);
  ppcVar2[1] = pcVar1;
  local_58 = local_200;
  fmt_01.str_.size_ = in_stack_fffffffffffffbe0;
  fmt_01.str_.data_ = in_stack_fffffffffffffbd8;
  ::fmt::v10::print<>(in_stack_fffffffffffffbd0,fmt_01);
  local_1e8 = &local_2d8;
  local_1f0 = "  create     Create a KTX2 file from various input files\n";
  local_c0 = "  create     Create a KTX2 file from various input files\n";
  local_2d8 = "  create     Create a KTX2 file from various input files\n";
  local_b8 = local_1e8;
  local_2d0 = std::char_traits<char>::length((char_type *)0x2ab573);
  local_48 = local_1f0;
  fmt_02.str_.size_ = in_stack_fffffffffffffbe0;
  fmt_02.str_.data_ = in_stack_fffffffffffffbd8;
  ::fmt::v10::print<>(in_stack_fffffffffffffbd0,fmt_02);
  os_00 = (ostream *)local_2e8;
  local_1d0 = "  deflate    Deflate (supercompress) a KTX2 file\n";
  local_e0 = "  deflate    Deflate (supercompress) a KTX2 file\n";
  local_2e8[0] = "  deflate    Deflate (supercompress) a KTX2 file\n";
  local_1c8 = os_00;
  local_d8 = os_00;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2ab61a);
  *(char **)(os_00 + 8) = pcVar1;
  local_38 = local_1d0;
  fmt_03.str_.size_ = in_stack_fffffffffffffbe0;
  fmt_03.str_.data_ = in_stack_fffffffffffffbd8;
  ::fmt::v10::print<>(os_00,fmt_03);
  ppcVar2 = local_2f8;
  local_1b0 = "  extract    Extract selected images from a KTX2 file\n";
  local_100 = "  extract    Extract selected images from a KTX2 file\n";
  local_2f8[0] = "  extract    Extract selected images from a KTX2 file\n";
  local_1a8 = ppcVar2;
  local_f8 = ppcVar2;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2ab6c1);
  pOVar3 = local_240;
  ppcVar2[1] = pcVar1;
  local_30 = local_1b0;
  fmt_04.str_.size_ = (size_t)ppcVar2;
  fmt_04.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_04);
  local_198 = &local_308;
  local_1a0 = "  encode     Encode a KTX2 file\n";
  local_110 = "  encode     Encode a KTX2 file\n";
  local_308 = "  encode     Encode a KTX2 file\n";
  local_108 = local_198;
  local_300 = std::char_traits<char>::length((char_type *)0x2ab768);
  local_28 = local_1a0;
  fmt_05.str_.size_ = (size_t)ppcVar2;
  fmt_05.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_05);
  local_188 = &local_318;
  local_190 = "  transcode  Transcode a KTX2 file\n";
  local_120 = "  transcode  Transcode a KTX2 file\n";
  local_318 = "  transcode  Transcode a KTX2 file\n";
  local_118 = local_188;
  local_310 = std::char_traits<char>::length((char_type *)0x2ab80f);
  local_20 = local_190;
  fmt_06.str_.size_ = (size_t)ppcVar2;
  fmt_06.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_06);
  local_1b8 = &local_328;
  local_1c0 = "  info       Print information about a KTX2 file\n";
  local_f0 = "  info       Print information about a KTX2 file\n";
  local_328 = "  info       Print information about a KTX2 file\n";
  local_e8 = local_1b8;
  local_320 = std::char_traits<char>::length((char_type *)0x2ab8b6);
  local_40 = local_1c0;
  fmt_07.str_.size_ = (size_t)ppcVar2;
  fmt_07.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_07);
  local_178 = &local_338;
  local_180 = "  validate   Validate a KTX2 file\n";
  local_130 = "  validate   Validate a KTX2 file\n";
  local_338 = "  validate   Validate a KTX2 file\n";
  local_128 = local_178;
  local_330 = std::char_traits<char>::length((char_type *)0x2ab963);
  local_18 = local_180;
  fmt_08.str_.size_ = (size_t)ppcVar2;
  fmt_08.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_08);
  local_168 = &local_348;
  local_170 = "  compare    Compare two KTX2 files\n";
  local_140 = "  compare    Compare two KTX2 files\n";
  local_348 = "  compare    Compare two KTX2 files\n";
  local_138 = local_168;
  local_340 = std::char_traits<char>::length((char_type *)0x2aba16);
  local_10 = local_170;
  fmt_09.str_.size_ = (size_t)ppcVar2;
  fmt_09.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_09);
  local_1d8 = &local_358;
  local_1e0 = "  help       Display help information about the ktx tool\n";
  local_d0 = "  help       Display help information about the ktx tool\n";
  local_358 = "  help       Display help information about the ktx tool\n";
  local_c8 = local_1d8;
  local_350 = std::char_traits<char>::length((char_type *)0x2abac9);
  local_50 = local_1e0;
  fmt_10.str_.size_ = (size_t)ppcVar2;
  fmt_10.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_10);
  local_208 = &local_368;
  local_210 = "\n";
  local_a0 = "\n";
  local_368 = "\n";
  local_98 = local_208;
  local_360 = std::char_traits<char>::length((char_type *)0x2abb7c);
  local_68 = local_210;
  fmt_11.str_.size_ = (size_t)ppcVar2;
  fmt_11.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_11);
  ppcVar4 = local_378;
  local_160 = 
  "For detailed usage and description of each subcommand use \'ktx help <command>\'\nor \'ktx <command> --help\'\n"
  ;
  local_150 = 
  "For detailed usage and description of each subcommand use \'ktx help <command>\'\nor \'ktx <command> --help\'\n"
  ;
  local_378[0] = 
  "For detailed usage and description of each subcommand use \'ktx help <command>\'\nor \'ktx <command> --help\'\n"
  ;
  local_158 = ppcVar4;
  local_148 = ppcVar4;
  pcVar1 = (char *)std::char_traits<char>::length((char_type *)0x2abc2f);
  ppcVar4[1] = pcVar1;
  local_8 = local_160;
  fmt_12.str_.size_ = (size_t)ppcVar2;
  fmt_12.str_.data_ = (char *)pOVar3;
  ::fmt::v10::print<>(os_00,fmt_12);
  return;
}

Assistant:

void Tools::printUsage(std::ostream& os, const cxxopts::Options& options) {
    fmt::print(os, "{}", options.help());

    fmt::print(os, "\n");
    fmt::print(os, "Available commands:\n");
    fmt::print(os, "  create     Create a KTX2 file from various input files\n");
    fmt::print(os, "  deflate    Deflate (supercompress) a KTX2 file\n");
    fmt::print(os, "  extract    Extract selected images from a KTX2 file\n");
    fmt::print(os, "  encode     Encode a KTX2 file\n");
    fmt::print(os, "  transcode  Transcode a KTX2 file\n");
    fmt::print(os, "  info       Print information about a KTX2 file\n");
    fmt::print(os, "  validate   Validate a KTX2 file\n");
    fmt::print(os, "  compare    Compare two KTX2 files\n");
    fmt::print(os, "  help       Display help information about the ktx tool\n");
#if KTX_DEVELOPER_FEATURE_PATCH
    fmt::print(os, "  patch      Apple certain patch operations to a KTX2 file.");
#endif
    fmt::print(os, "\n");
    fmt::print(os, "For detailed usage and description of each subcommand use 'ktx help <command>'\n"
                   "or 'ktx <command> --help'\n");
}